

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::AddString
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,string *value)

{
  RepeatedPtrFieldBase *this_00;
  int iVar1;
  int iVar2;
  LogMessage *other;
  string *psVar3;
  long lVar4;
  LogFinisher local_69;
  LogMessage local_68;
  
  if (*(Descriptor **)(field + 0x38) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"AddString","Field does not match message type.");
  }
  if (*(int *)(field + 0x30) != 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"AddString",
               "Field is singular; the method requires a repeated field.");
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x2c) * 4) != 9) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"AddString",CPPTYPE_STRING);
  }
  if (field[0x34] == (FieldDescriptor)0x1) {
    if (this->extensions_offset_ == -1) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/generated_message_reflection.cc"
                 ,0x4b5);
      other = LogMessage::operator<<(&local_68,"CHECK failed: (extensions_offset_) != (-1): ");
      LogFinisher::operator=(&local_69,other);
      LogMessage::~LogMessage(&local_68);
    }
    psVar3 = ExtensionSet::AddString_abi_cxx11_
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite +
                        (long)this->extensions_offset_),*(int *)(field + 0x28),
                        (FieldType)field[0x2c],field);
  }
  else {
    lVar4 = (long)this->offsets_
                  [(int)((ulong)((long)field - *(long *)(*(long *)(field + 0x38) + 0x30)) >> 3) *
                   -0x11111111];
    this_00 = (RepeatedPtrFieldBase *)
              ((long)&(message->super_MessageLite)._vptr_MessageLite + lVar4);
    iVar1 = *(int *)((long)&message[1].super_MessageLite._vptr_MessageLite + lVar4);
    iVar2 = *(int *)((long)&message[1].super_MessageLite._vptr_MessageLite + lVar4 + 4);
    if (iVar1 < iVar2) {
      this_00->current_size_ = iVar1 + 1;
      psVar3 = (string *)this_00->elements_[iVar1];
    }
    else {
      if (iVar2 == this_00->total_size_) {
        RepeatedPtrFieldBase::Reserve(this_00,this_00->total_size_ + 1);
      }
      this_00->allocated_size_ = this_00->allocated_size_ + 1;
      psVar3 = StringTypeHandlerBase::New_abi_cxx11_();
      iVar1 = this_00->current_size_;
      this_00->current_size_ = iVar1 + 1;
      this_00->elements_[iVar1] = psVar3;
    }
  }
  std::__cxx11::string::_M_assign((string *)psVar3);
  return;
}

Assistant:

void GeneratedMessageReflection::AddString(
    Message* message, const FieldDescriptor* field,
    const string& value) const {
  USAGE_CHECK_ALL(AddString, REPEATED, STRING);
  if (field->is_extension()) {
    MutableExtensionSet(message)->AddString(field->number(),
                                            field->type(), value, field);
  } else {
    switch (field->options().ctype()) {
      default:  // TODO(kenton):  Support other string reps.
      case FieldOptions::STRING:
        *AddField<string>(message, field) = value;
        break;
    }
  }
}